

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::SourceTreeDescriptorDatabase::SingleFileErrorCollector::
SingleFileErrorCollector
          (SingleFileErrorCollector *this,string *filename,
          MultiFileErrorCollector *multi_file_error_collector)

{
  (this->super_ErrorCollector)._vptr_ErrorCollector =
       (_func_int **)&PTR__SingleFileErrorCollector_0079b9b0;
  std::__cxx11::string::string((string *)&this->filename_,(string *)filename);
  this->multi_file_error_collector_ = multi_file_error_collector;
  this->had_errors_ = false;
  return;
}

Assistant:

SingleFileErrorCollector(const std::string& filename,
                           MultiFileErrorCollector* multi_file_error_collector)
      : filename_(filename),
        multi_file_error_collector_(multi_file_error_collector),
        had_errors_(false) {}